

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
__thiscall
duckdb::BaseReservoirSampling::Deserialize(BaseReservoirSampling *this,Deserializer *deserializer)

{
  BaseReservoirSampling *this_00;
  pointer pBVar1;
  
  this_00 = (BaseReservoirSampling *)operator_new(0x78);
  BaseReservoirSampling(this_00);
  *(BaseReservoirSampling **)&(this->random).super_RandomEngine.lock.super___mutex_base._M_mutex =
       this_00;
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,100,"next_index_to_sample",&pBVar1->next_index_to_sample);
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::ReadProperty<double>
            (deserializer,0x65,"min_weight_threshold",&pBVar1->min_weight_threshold);
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0x66,"min_weighted_entry_index",&pBVar1->min_weighted_entry_index);
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0x67,"num_entries_to_skip_b4_next_sample",
             &pBVar1->num_entries_to_skip_b4_next_sample);
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0x68,"num_entries_seen_total",&pBVar1->num_entries_seen_total);
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->((unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                         *)this);
  Deserializer::
  ReadPropertyWithDefault<std::priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>>
            (deserializer,0x69,"reservoir_weights",&pBVar1->reservoir_weights);
  return (unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
          )(unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
            )this;
}

Assistant:

unique_ptr<BaseReservoirSampling> BaseReservoirSampling::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<BaseReservoirSampling>(new BaseReservoirSampling());
	deserializer.ReadPropertyWithDefault<idx_t>(100, "next_index_to_sample", result->next_index_to_sample);
	deserializer.ReadProperty<double>(101, "min_weight_threshold", result->min_weight_threshold);
	deserializer.ReadPropertyWithDefault<idx_t>(102, "min_weighted_entry_index", result->min_weighted_entry_index);
	deserializer.ReadPropertyWithDefault<idx_t>(103, "num_entries_to_skip_b4_next_sample", result->num_entries_to_skip_b4_next_sample);
	deserializer.ReadPropertyWithDefault<idx_t>(104, "num_entries_seen_total", result->num_entries_seen_total);
	deserializer.ReadPropertyWithDefault<std::priority_queue<std::pair<double, idx_t>>>(105, "reservoir_weights", result->reservoir_weights);
	return result;
}